

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_tree.c
# Opt level: O0

trt_parent_cache tro_parent_cache_for_child(trt_parent_cache ca,trt_tree_ctx *tc)

{
  lysp_node_list *plVar1;
  trt_parent_cache tVar2;
  lysp_node_list *local_60;
  trt_ancestor_type local_44;
  trt_ancestor_type local_40;
  trt_ancestor_type local_3c;
  lysp_node *pn;
  trt_tree_ctx *tc_local;
  trt_parent_cache ca_local;
  trt_parent_cache ret;
  
  local_60 = ca.last_list;
  ca_local.last_list._0_4_ = TRD_ANCESTOR_ELSE;
  ca_local.last_list._4_2_ = 4;
  ca_local.last_list._6_2_ = 1;
  ret.ancestor = TRD_ANCESTOR_ELSE;
  ret.lys_status = 0;
  ret.lys_config = 0;
  if (tc->lysc_tree == '\0') {
    plVar1 = (lysp_node_list *)tc->pn;
    tc_local._0_4_ = ca.ancestor;
    if (((plVar1->field_0).node.nodetype & 0x1000) == 0) {
      if (((plVar1->field_0).node.nodetype & 0x2000) == 0) {
        if (((plVar1->field_0).node.nodetype & 0x400) == 0) {
          local_44 = (trt_ancestor_type)tc_local;
        }
        else {
          local_44 = TRD_ANCESTOR_NOTIF;
        }
        local_40 = local_44;
      }
      else {
        local_40 = TRD_ANCESTOR_RPC_OUTPUT;
      }
      local_3c = local_40;
    }
    else {
      local_3c = TRD_ANCESTOR_RPC_INPUT;
    }
    ca_local.last_list._0_4_ = local_3c;
    if (((plVar1->field_0).node.flags & 0x1c) == 0) {
      tc_local._4_2_ = ca.lys_status;
      ca_local.last_list._4_2_ = tc_local._4_2_;
    }
    else {
      ca_local.last_list._4_2_ = (plVar1->field_0).node.flags;
    }
    if ((trt_ancestor_type)tc_local == TRD_ANCESTOR_RPC_INPUT) {
      ca_local.last_list._6_2_ = 0;
    }
    else if ((trt_ancestor_type)tc_local == TRD_ANCESTOR_RPC_OUTPUT) {
      ca_local.last_list._6_2_ = 2;
    }
    else if (((plVar1->field_0).node.flags & 3) == 0) {
      tc_local._6_2_ = ca.lys_config;
      ca_local.last_list._6_2_ = tc_local._6_2_;
    }
    else {
      ca_local.last_list._6_2_ = (plVar1->field_0).node.flags;
    }
    if (((plVar1->field_0).node.nodetype & 0x10) != 0) {
      local_60 = plVar1;
    }
    ret._0_8_ = local_60;
  }
  tVar2.lys_status = ca_local.last_list._4_2_;
  tVar2.ancestor = (trt_ancestor_type)ca_local.last_list;
  tVar2.lys_config = ca_local.last_list._6_2_;
  tVar2.last_list = (lysp_node_list *)ret._0_8_;
  return tVar2;
}

Assistant:

static struct trt_parent_cache
tro_parent_cache_for_child(struct trt_parent_cache ca, const struct trt_tree_ctx *tc)
{
    struct trt_parent_cache ret = TRP_EMPTY_PARENT_CACHE;

    if (!tc->lysc_tree) {
        const struct lysp_node *pn = tc->pn;

        ret.ancestor =
                pn->nodetype & (LYS_INPUT) ? TRD_ANCESTOR_RPC_INPUT :
                pn->nodetype & (LYS_OUTPUT) ? TRD_ANCESTOR_RPC_OUTPUT :
                pn->nodetype & (LYS_NOTIF) ? TRD_ANCESTOR_NOTIF :
                ca.ancestor;

        ret.lys_status =
                pn->flags & (LYS_STATUS_CURR | LYS_STATUS_DEPRC | LYS_STATUS_OBSLT) ? pn->flags :
                ca.lys_status;

        ret.lys_config =
                ca.ancestor == TRD_ANCESTOR_RPC_INPUT ? 0 : /* because <flags> will be -w */
                ca.ancestor == TRD_ANCESTOR_RPC_OUTPUT ? LYS_CONFIG_R :
                pn->flags & (LYS_CONFIG_R | LYS_CONFIG_W) ? pn->flags :
                ca.lys_config;

        ret.last_list =
                pn->nodetype & (LYS_LIST) ? (struct lysp_node_list *)pn :
                ca.last_list;
    }

    return ret;
}